

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

FILE * open_input(char *filename)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *__dest;
  FILE *pFVar4;
  FILE *res;
  char *cmd;
  int elen;
  int flen;
  int i;
  char *tab [4] [2];
  char *filename_local;
  
  tab[3][1] = filename;
  memcpy(&flen,&DAT_002a8d90,0x40);
  sVar3 = strlen(tab[3][1]);
  iVar1 = (int)sVar3;
  elen = 0;
  while( true ) {
    if (3 < (uint)elen) {
      pFVar4 = fopen(tab[3][1],"r");
      return (FILE *)pFVar4;
    }
    sVar3 = strlen(*(char **)(&flen + (long)elen * 4));
    if (((int)sVar3 < iVar1) &&
       (iVar2 = strcmp(tab[3][1] + ((long)iVar1 - (long)(int)sVar3),
                       *(char **)(&flen + (long)elen * 4)), iVar2 == 0)) break;
    elen = elen + 1;
  }
  sVar3 = strlen(tab[elen][0]);
  __dest = (char *)malloc((long)iVar1 + sVar3 + 2);
  strcpy(__dest,tab[elen][0]);
  strcat(__dest," ");
  strcat(__dest,tab[3][1]);
  pFVar4 = popen(__dest,"r");
  free(__dest);
  return (FILE *)pFVar4;
}

Assistant:

FILE *open_input(const char *filename) {
	const char * const tab[][2] = {
		{ ".gz", "zcat" },
		{ ".Z", "zcat" },
		{ ".bz2", "bzcat" },
		{ ".xz", "xzcat" },
	};
	int i;
	int flen = strlen(filename);
	for (i = 0; i < sizeof tab / sizeof tab[0]; i++) {
		int elen = strlen(tab[i][0]);
		if (flen > elen && !strcmp(filename + flen - elen, tab[i][0])) {
			char *cmd = malloc(flen + strlen(tab[i][1]) + 2);
			FILE *res;
			strcpy(cmd, tab[i][1]);
			strcat(cmd, " ");
			strcat(cmd, filename);
			res = popen(cmd, "r");
			free(cmd);
			return res;
		}
	}
	return fopen(filename, "r");
}